

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_putByte(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue obj;
  JSValue val;
  JSValue JVar1;
  FILE *__stream;
  undefined4 in_ECX;
  undefined8 in_RDX;
  JSContext *in_RSI;
  int32_t *in_RDI;
  JSContext *in_R8;
  int c;
  FILE *f;
  undefined4 local_64;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined4 uStack_c;
  
  obj.u._4_4_ = in_ECX;
  obj.u.int32 = in_stack_ffffffffffffffb0;
  obj.tag = (int64_t)in_RDI;
  __stream = (FILE *)js_std_file_get(in_R8,obj);
  if (__stream == (FILE *)0x0) {
    iVar2 = 0;
    local_28 = 6;
  }
  else {
    val.tag._0_4_ = in_stack_ffffffffffffffd0;
    val.u = (JSValueUnion)in_RDX;
    val.tag._4_4_ = in_stack_ffffffffffffffd4;
    iVar2 = JS_ToInt32(in_RSI,in_RDI,val);
    if (iVar2 == 0) {
      iVar2 = fputc(local_64,__stream);
      local_28 = 0;
      in_stack_ffffffffffffffd4 = uStack_c;
    }
    else {
      iVar2 = 0;
      local_28 = 6;
    }
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = iVar2;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_std_file_putByte(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    if (!f)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &c, argv[0]))
        return JS_EXCEPTION;
    c = fputc(c, f);
    return JS_NewInt32(ctx, c);
}